

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O3

TestResult *
JsonTest::checkEqual<char_const*,std::__cxx11::string>
          (TestResult *result,char *expected,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual,char *file,
          uint line,char *expr)

{
  _Alloc_hider _Var1;
  int iVar2;
  TestResult *pTVar3;
  bool bVar4;
  allocator local_5d;
  uint local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char *local_38;
  
  local_5c = line;
  local_38 = expr;
  std::__cxx11::string::string((string *)&local_58,expected,&local_5d);
  _Var1._M_p = local_58._M_dataplus._M_p;
  if (local_58._M_string_length == actual->_M_string_length) {
    if (local_58._M_string_length == 0) {
      bVar4 = false;
    }
    else {
      iVar2 = bcmp(local_58._M_dataplus._M_p,(actual->_M_dataplus)._M_p,local_58._M_string_length);
      bVar4 = iVar2 != 0;
    }
  }
  else {
    bVar4 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p != &local_58.field_2) {
    operator_delete(_Var1._M_p);
  }
  if (bVar4) {
    TestResult::addFailure(result,file,local_5c,local_38);
    pTVar3 = TestResult::operator<<(result,(char (*) [11])"Expected: ");
    std::__cxx11::string::string((string *)&local_58,expected,&local_5d);
    pTVar3 = TestResult::operator<<(pTVar3,&local_58);
    TestResult::operator<<(pTVar3,(char (*) [2])0x14a14b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    pTVar3 = TestResult::operator<<(result,(char (*) [11])"Actual  : ");
    TestResult::operator<<(pTVar3,actual);
  }
  return result;
}

Assistant:

TestResult& checkEqual(TestResult& result,
                       T expected,
                       U actual,
                       const char* file,
                       unsigned int line,
                       const char* expr) {
  if (static_cast<U>(expected) != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: " << static_cast<U>(expected) << "\n";
    result << "Actual  : " << actual;
  }
  return result;
}